

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

CollationKey * __thiscall
icu_63::RuleBasedCollator::getCollationKey
          (RuleBasedCollator *this,UChar *s,int32_t length,CollationKey *key,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t newLength;
  undefined1 local_60 [8];
  CollationKeyByteSink sink;
  UErrorCode *errorCode_local;
  CollationKey *key_local;
  int32_t length_local;
  UChar *s_local;
  RuleBasedCollator *this_local;
  
  sink.key_ = (CollationKey *)errorCode;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if ((s == (UChar *)0x0) && (length != 0)) {
      *(undefined4 *)&((sink.key_)->super_UObject)._vptr_UObject = 1;
      this_local = (RuleBasedCollator *)CollationKey::setToBogus(key);
    }
    else {
      CollationKey::reset(key);
      CollationKeyByteSink::CollationKeyByteSink((CollationKeyByteSink *)local_60,key);
      writeSortKey(this,s,length,(SortKeyByteSink *)local_60,(UErrorCode *)sink.key_);
      UVar1 = ::U_FAILURE(*(UErrorCode *)&((sink.key_)->super_UObject)._vptr_UObject);
      if (UVar1 == '\0') {
        UVar1 = CollationKey::isBogus(key);
        if (UVar1 == '\0') {
          newLength = SortKeyByteSink::NumberOfBytesAppended((SortKeyByteSink *)local_60);
          CollationKey::setLength(key,newLength);
        }
        else {
          *(undefined4 *)&((sink.key_)->super_UObject)._vptr_UObject = 7;
        }
      }
      else {
        CollationKey::setToBogus(key);
      }
      CollationKeyByteSink::~CollationKeyByteSink((CollationKeyByteSink *)local_60);
      this_local = (RuleBasedCollator *)key;
    }
  }
  else {
    this_local = (RuleBasedCollator *)CollationKey::setToBogus(key);
  }
  return (CollationKey *)this_local;
}

Assistant:

CollationKey &
RuleBasedCollator::getCollationKey(const UChar *s, int32_t length, CollationKey& key,
                                   UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        return key.setToBogus();
    }
    if(s == NULL && length != 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return key.setToBogus();
    }
    key.reset();  // resets the "bogus" state
    CollationKeyByteSink sink(key);
    writeSortKey(s, length, sink, errorCode);
    if(U_FAILURE(errorCode)) {
        key.setToBogus();
    } else if(key.isBogus()) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
    } else {
        key.setLength(sink.NumberOfBytesAppended());
    }
    return key;
}